

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ostream *poVar1;
  undefined1 local_168 [8];
  RayTracer tracer;
  RayTracerConfig config;
  allocator local_11;
  
  tracer.threadNumber = 2;
  tracer._172_4_ = 1;
  config.super_BaseConfig.antiAliasing = 0x3dcccccd;
  config.super_BaseConfig.light.y._0_2_ = 0;
  config.super_BaseConfig.light.y._2_1_ = 0;
  config.super_BaseConfig.background.r = '\0';
  config.super_BaseConfig.background.g = '\0';
  config.super_BaseConfig.background.b = '\0';
  config.super_BaseConfig._51_1_ = 0;
  config._52_4_ = 0;
  config.spheres.super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  config.spheres.super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  config.spheres.super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  config.planes.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  config.planes.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  config.planes.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  config.triangles.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  config.triangles.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (argc < 2) {
    poVar1 = std::operator<<((ostream *)&std::cerr,"Using default config");
    std::endl<char,std::char_traits<char>>(poVar1);
    RayTracerConfig::defaultConfig();
    RayTracerConfig::operator=((RayTracerConfig *)&tracer.threadNumber,(RayTracerConfig *)local_168)
    ;
    RayTracerConfig::~RayTracerConfig((RayTracerConfig *)local_168);
  }
  else {
    poVar1 = std::operator<<((ostream *)&std::cerr,"Reading config from file ");
    poVar1 = std::operator<<(poVar1,argv[1]);
    std::endl<char,std::char_traits<char>>(poVar1);
    std::__cxx11::string::string
              ((string *)
               &config.triangles.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,argv[1],&local_11);
    RayTracerConfig::fromFile
              ((RayTracerConfig *)local_168,
               (string *)
               &config.triangles.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    RayTracerConfig::operator=((RayTracerConfig *)&tracer.threadNumber,(RayTracerConfig *)local_168)
    ;
    RayTracerConfig::~RayTracerConfig((RayTracerConfig *)local_168);
    std::__cxx11::string::~string
              ((string *)
               &config.triangles.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  operator<<((ostream *)&std::cerr,(RayTracerConfig *)&tracer.threadNumber);
  RayTracer::RayTracer((RayTracer *)local_168,(RayTracerConfig *)&tracer.threadNumber);
  RayTracer::processPixels((RayTracer *)local_168);
  RayTracerBase::printBitmap((RayTracerBase *)local_168,(ostream *)&std::cout);
  RayTracerBase::~RayTracerBase((RayTracerBase *)local_168);
  RayTracerConfig::~RayTracerConfig((RayTracerConfig *)&tracer.threadNumber);
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
  RayTracerConfig config;
  if (argc > 1)
  {
    std::cerr << "Reading config from file " << argv[1] << std::endl;
    config = RayTracerConfig::fromFile(argv[1]);
  }
  else
  {
    std::cerr << "Using default config" << std::endl;
    config = RayTracerConfig::defaultConfig();
  }
  std::cerr << config;

  RayTracer tracer(config);
  tracer.processPixels();
  tracer.printBitmap(std::cout);
}